

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsencoding.h
# Opt level: O2

void vsencoding::__vseblocks_unpack7(uint32_t *out,uint32_t *in,uint32_t bs)

{
  uint uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  uint uVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  
  auVar19 = vpmovsxbd_avx512f(_DAT_001855d0);
  auVar4 = vpmovsxbd_avx(ZEXT416(0x206));
  auVar5 = vpmovsxbd_avx(ZEXT416(0x7c40));
  auVar20 = vpmovsxbd_avx512f(_DAT_001855e0);
  auVar21 = vpbroadcastd_avx512f(ZEXT416(0x7f));
  auVar22 = vbroadcasti64x4_avx512f(_DAT_00185260);
  auVar6 = vpmovsxbd_avx(ZEXT416(0x1010505));
  auVar7 = vpmovsxbd_avx(ZEXT416(0x7e7e6060));
  auVar11 = vpmovsxbd_avx2(ZEXT816(0xf0e0d0101010100));
  auVar12 = vpmovsxbd_avx2(ZEXT816(0x11181f060d141b02));
  auVar8 = vpmovsxbd_avx(ZEXT416(0x151c030a));
  auVar9 = vpmovsxbd_avx(ZEXT416(0x70e));
  uVar15 = bs + 0x1f >> 5;
  while (bVar16 = uVar15 != 0, uVar15 = uVar15 - 1, bVar16) {
    auVar17 = *(undefined1 (*) [16])in;
    uVar1 = *(uint *)*(undefined1 (*) [16])in;
    *out = uVar1 >> 0x19;
    auVar26 = auVar21._0_16_;
    auVar27 = vpinsrd_avx(auVar26,(uVar1 & 0xf) << 3,3);
    uVar2 = *(ulong *)(*(undefined1 (*) [16])((long)in + 0x10) + 4);
    auVar10 = vpshufd_avx(auVar17,0xe9);
    auVar23 = vpermd_avx512f(auVar19,ZEXT1664(auVar17));
    auVar17 = vpshufd_avx(auVar17,0xff);
    auVar3 = vpinsrd_avx(auVar17,*(undefined4 *)*(undefined1 (*) [16])((long)in + 0x10),1);
    in = (uint32_t *)(*(undefined1 (*) [16])((long)in + 0x10) + 0xc);
    auVar17 = vpsllvd_avx2(auVar10,auVar4);
    auVar17 = vpand_avx(auVar17,auVar5);
    auVar24 = vpermt2d_avx512f(ZEXT1664(auVar17),auVar22,ZEXT1664(auVar27));
    auVar23 = vpsrlvd_avx512f(auVar23,auVar20);
    auVar25 = vpandd_avx512f(auVar23,auVar21);
    auVar23 = vpord_avx512f(auVar23,auVar24);
    auVar24._0_12_ = auVar25._0_12_;
    auVar24._12_4_ = auVar23._12_4_;
    auVar24._16_4_ = auVar25._16_4_;
    auVar24._20_4_ = auVar25._20_4_;
    auVar24._24_4_ = auVar25._24_4_;
    auVar24._28_4_ = auVar25._28_4_;
    auVar24._32_4_ = auVar23._32_4_;
    auVar24._36_4_ = auVar25._36_4_;
    auVar24._40_4_ = auVar25._40_4_;
    auVar24._44_4_ = auVar25._44_4_;
    auVar24._48_4_ = auVar23._48_4_;
    auVar24._52_4_ = auVar25._52_4_;
    auVar24._56_4_ = auVar25._56_4_;
    auVar24._60_4_ = auVar25._60_4_;
    auVar17 = vpshufd_avx(auVar3,0x50);
    auVar23 = vmovdqu64_avx512f(auVar24);
    *(undefined1 (*) [64])(out + 1) = auVar23;
    auVar18 = vpbroadcastd_avx512vl();
    auVar17 = vpsllvd_avx2(auVar17,auVar6);
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uVar2;
    auVar27 = vpshufd_avx(auVar27,0x50);
    auVar18 = vpermt2d_avx512vl(ZEXT1632(auVar3),auVar11,auVar18);
    auVar17 = vpand_avx(auVar17,auVar7);
    auVar3 = vpsrlvd_avx2(auVar27,auVar8);
    auVar13 = vpermq_avx2(ZEXT1632(auVar17),0xd4);
    auVar14 = vpsrlvd_avx2(auVar18,auVar12);
    auVar18 = vpand_avx2(auVar14,auVar21._0_32_);
    auVar13 = vpor_avx2(auVar14,auVar13);
    auVar17 = vpand_avx(auVar3,auVar26);
    auVar18 = vpblendd_avx2(auVar18,auVar13,0x22);
    *(undefined1 (*) [32])(out + 0x11) = auVar18;
    auVar27 = vpinsrd_avx(auVar26,((uint)uVar2 & 7) << 4,2);
    auVar27 = vpor_avx(auVar3,auVar27);
    auVar17 = vpblendd_avx2(auVar17,auVar27,4);
    *(undefined1 (*) [16])(out + 0x19) = auVar17;
    auVar17 = vpbroadcastd_avx512vl();
    auVar17 = vpsrlvd_avx2(auVar17,auVar9);
    auVar17 = vpand_avx(auVar17,auVar26);
    *(long *)(out + 0x1d) = auVar17._0_8_;
    out[0x1f] = (uint)(uVar2 >> 0x20) & 0x7f;
    out = out + 0x20;
  }
  return;
}

Assistant:

void __vseblocks_unpack7(uint32_t *__restrict__ out,
                         const uint32_t *__restrict__ in, uint32_t bs) {
  for (bs = (bs + 31U) / 32U; bs > 0; out += 32, in += 7, --bs) {
    out[0] = in[0] >> 25;
    out[1] = (in[0] >> 18) & 0x7f;
    out[2] = (in[0] >> 11) & 0x7f;
    out[3] = (in[0] >> 4) & 0x7f;
    out[4] = (in[0] << 3) & 0x7f;
    out[4] |= in[1] >> 29;
    out[5] = (in[1] >> 22) & 0x7f;
    out[6] = (in[1] >> 15) & 0x7f;
    out[7] = (in[1] >> 8) & 0x7f;
    out[8] = (in[1] >> 1) & 0x7f;
    out[9] = (in[1] << 6) & 0x7f;
    out[9] |= in[2] >> 26;
    out[10] = (in[2] >> 19) & 0x7f;
    out[11] = (in[2] >> 12) & 0x7f;
    out[12] = (in[2] >> 5) & 0x7f;
    out[13] = (in[2] << 2) & 0x7f;
    out[13] |= in[3] >> 30;
    out[14] = (in[3] >> 23) & 0x7f;
    out[15] = (in[3] >> 16) & 0x7f;
    out[16] = (in[3] >> 9) & 0x7f;
    out[17] = (in[3] >> 2) & 0x7f;
    out[18] = (in[3] << 5) & 0x7f;
    out[18] |= in[4] >> 27;
    out[19] = (in[4] >> 20) & 0x7f;
    out[20] = (in[4] >> 13) & 0x7f;
    out[21] = (in[4] >> 6) & 0x7f;
    out[22] = (in[4] << 1) & 0x7f;
    out[22] |= in[5] >> 31;
    out[23] = (in[5] >> 24) & 0x7f;
    out[24] = (in[5] >> 17) & 0x7f;
    out[25] = (in[5] >> 10) & 0x7f;
    out[26] = (in[5] >> 3) & 0x7f;
    out[27] = (in[5] << 4) & 0x7f;
    out[27] |= in[6] >> 28;
    out[28] = (in[6] >> 21) & 0x7f;
    out[29] = (in[6] >> 14) & 0x7f;
    out[30] = (in[6] >> 7) & 0x7f;
    out[31] = in[6] & 0x7f;
  }
}